

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextBlockData>::previous(QFragmentMapData<QTextBlockData> *this,uint n)

{
  uint uVar1;
  Header *pHVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  pHVar2 = (this->field_0).head;
  if (n == 0) {
    uVar3 = maximum(this,pHVar2->root);
    return uVar3;
  }
  uVar5 = (ulong)n;
  uVar1 = *(uint *)((long)pHVar2 + uVar5 * 0x48 + 4);
  if (uVar1 == 0) {
    do {
      uVar4 = *(uint *)(uVar5 * 0x48 + (long)pHVar2);
      uVar5 = (ulong)uVar4;
      if (*(int *)((long)pHVar2 + (ulong)n * 0x48) == 0) {
        return uVar4;
      }
      bVar6 = n == *(uint *)((long)pHVar2 + uVar5 * 0x48 + 4);
      n = uVar4;
    } while (bVar6);
  }
  else {
    do {
      uVar4 = uVar1;
      uVar1 = *(uint *)((long)pHVar2 + (ulong)uVar4 * 0x48 + 8);
    } while (uVar1 != 0);
  }
  return uVar4;
}

Assistant:

uint QFragmentMapData<Fragment>::previous(uint n) const {
    if (!n)
        return maximum(root());

    if (F(n).left) {
        n = F(n).left;
        while (F(n).right)
            n = F(n).right;
    } else {
        uint y = F(n).parent;
        while (F(n).parent && n == F(y).left) {
            n = y;
            y = F(y).parent;
        }
        n = y;
    }
    return n;
}